

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpack.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  undefined8 in_RSI;
  undefined8 *puVar2;
  int in_EDI;
  undefined8 *puVar3;
  byte bVar4;
  int unaff_retaddr;
  char **in_stack_00000008;
  int in_stack_00000014;
  fpstate in_stack_00000020;
  fpstate fpvar;
  undefined8 auStack_d88 [134];
  fpstate *in_stack_fffffffffffff6a8;
  undefined4 in_stack_fffffffffffff6b0;
  int in_stack_fffffffffffff6b4;
  char **in_stack_fffffffffffff6b8;
  int in_stack_fffffffffffff6c4;
  undefined1 in_stack_fffffffffffff6d0 [1704];
  undefined1 auVar5 [1704];
  fpstate fpvar_00;
  
  bVar4 = 0;
  if (in_EDI < 2) {
    fp_usage();
    fp_hint();
    exit(-1);
  }
  fp_init((fpstate *)&stack0xfffffffffffff948);
  fp_get_param(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6b8,
               (fpstate *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
  if (in_stack_fffffffffffff6d0._732_4_ == 0) {
    fp_preflight(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b4,
                 in_stack_fffffffffffff6a8);
    puVar2 = (undefined8 *)&stack0xfffffffffffff948;
    puVar3 = auStack_d88;
    for (lVar1 = 0xd5; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    fp_loop(in_stack_00000014,in_stack_00000008,unaff_retaddr,in_stack_00000020);
  }
  else {
    auVar5._632_1072_ = in_stack_fffffffffffff6d0._632_1072_;
    auVar5._0_628_ = in_stack_fffffffffffff6d0._0_628_;
    auVar5._628_4_ = in_EDI;
    fpvar_00._624_1080_ = auVar5._624_1080_;
    fpvar_00._0_616_ = in_stack_fffffffffffff6d0._0_616_;
    fpvar_00.prefix._476_8_ = in_RSI;
    puVar2 = (undefined8 *)&stack0xfffffffffffff948;
    puVar3 = auStack_d88;
    for (lVar1 = 0xd5; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
      puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
    }
    fp_list(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6b8,fpvar_00);
  }
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
	fpstate	fpvar;

	if (argc <= 1) { fp_usage (); fp_hint (); exit (-1); }

	fp_init (&fpvar);
	fp_get_param (argc, argv, &fpvar);

	if (fpvar.listonly) {
	    fp_list (argc, argv, fpvar);

	} else {
	    fp_preflight (argc, argv, FPACK, &fpvar);
	    fp_loop (argc, argv, FPACK, fpvar);
	}

	exit (0);
}